

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.h
# Opt level: O0

bool match_literal_fast(char c,StreamCursor *cursor)

{
  bool bVar1;
  char cVar2;
  StreamCursor *cursor_local;
  char c_local;
  
  bVar1 = StreamCursor::eof(cursor);
  if (bVar1) {
    cursor_local._7_1_ = false;
  }
  else {
    cVar2 = StreamCursor::current(cursor);
    if (c == cVar2) {
      StreamCursor::advance(cursor,1);
      cursor_local._7_1_ = true;
    }
    else {
      cursor_local._7_1_ = false;
    }
  }
  return cursor_local._7_1_;
}

Assistant:

inline bool match_literal_fast(char c, StreamCursor& cursor)
{
    if (cursor.eof())
        return false;

    if (c == cursor.current()) {
        cursor.advance(1);
        return true;
    }

    return false;
}